

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# profiledata.cc
# Opt level: O0

void __thiscall ProfileData::Add(ProfileData *this,int depth,void **stack)

{
  bool bVar1;
  bool bVar2;
  Entry *pEVar3;
  Entry *pEVar4;
  int local_70;
  int local_6c;
  int i_2;
  int a_1;
  Entry *e_1;
  int i_1;
  bool match;
  Entry *e;
  int a;
  Bucket *bucket;
  bool done;
  Slot slot;
  ulong uStack_28;
  int i;
  Slot h;
  void **stack_local;
  int depth_local;
  ProfileData *this_local;
  
  bVar2 = enabled(this);
  if (bVar2) {
    stack_local._4_4_ = depth;
    if (0xfe < depth) {
      stack_local._4_4_ = 0xfe;
    }
    if (stack_local._4_4_ < 1) {
      syscall(1,2,"Check failed: depth > 0: ProfileData::Add depth <= 0\n",0x35);
      abort();
    }
    uStack_28 = 0;
    for (slot._4_4_ = 0; slot._4_4_ < stack_local._4_4_; slot._4_4_ = slot._4_4_ + 1) {
      uStack_28 = (long)stack[slot._4_4_] * 0x29 + (uStack_28 << 8 | uStack_28 >> 0x38);
    }
    this->count_ = this->count_ + 1;
    bVar2 = false;
    pEVar3 = this->hash_[uStack_28 & 0x3ff].entry;
    for (e._4_4_ = 0; e._4_4_ < 4; e._4_4_ = e._4_4_ + 1) {
      pEVar4 = pEVar3 + e._4_4_;
      if (pEVar4->depth == (long)stack_local._4_4_) {
        bVar1 = true;
        for (e_1._0_4_ = 0; (int)e_1 < stack_local._4_4_; e_1._0_4_ = (int)e_1 + 1) {
          if ((void *)pEVar4->stack[(int)e_1] != stack[(int)e_1]) {
            bVar1 = false;
            break;
          }
        }
        if (bVar1) {
          pEVar4->count = pEVar4->count + 1;
          bVar2 = true;
          break;
        }
      }
    }
    if (!bVar2) {
      _i_2 = pEVar3;
      for (local_6c = 1; local_6c < 4; local_6c = local_6c + 1) {
        if (pEVar3[local_6c].count < _i_2->count) {
          _i_2 = pEVar3 + local_6c;
        }
      }
      if (_i_2->count != 0) {
        this->evictions_ = this->evictions_ + 1;
        Evict(this,_i_2);
      }
      _i_2->depth = (long)stack_local._4_4_;
      _i_2->count = 1;
      for (local_70 = 0; local_70 < stack_local._4_4_; local_70 = local_70 + 1) {
        _i_2->stack[local_70] = (Slot)stack[local_70];
      }
    }
  }
  return;
}

Assistant:

void ProfileData::Add(int depth, const void* const* stack) {
  if (!enabled()) {
    return;
  }

  if (depth > kMaxStackDepth) depth = kMaxStackDepth;
  RAW_CHECK(depth > 0, "ProfileData::Add depth <= 0");

  // Make hash-value
  Slot h = 0;
  for (int i = 0; i < depth; i++) {
    Slot slot = reinterpret_cast<Slot>(stack[i]);
    h = (h << 8) | (h >> (8*(sizeof(h)-1)));
    h += (slot * 31) + (slot * 7) + (slot * 3);
  }

  count_++;

  // See if table already has an entry for this trace
  bool done = false;
  Bucket* bucket = &hash_[h % kBuckets];
  for (int a = 0; a < kAssociativity; a++) {
    Entry* e = &bucket->entry[a];
    if (e->depth == depth) {
      bool match = true;
      for (int i = 0; i < depth; i++) {
        if (e->stack[i] != reinterpret_cast<Slot>(stack[i])) {
          match = false;
          break;
        }
      }
      if (match) {
        e->count++;
        done = true;
        break;
      }
    }
  }

  if (!done) {
    // Evict entry with smallest count
    Entry* e = &bucket->entry[0];
    for (int a = 1; a < kAssociativity; a++) {
      if (bucket->entry[a].count < e->count) {
        e = &bucket->entry[a];
      }
    }
    if (e->count > 0) {
      evictions_++;
      Evict(*e);
    }

    // Use the newly evicted entry
    e->depth = depth;
    e->count = 1;
    for (int i = 0; i < depth; i++) {
      e->stack[i] = reinterpret_cast<Slot>(stack[i]);
    }
  }
}